

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_Join::test_method(util_Join *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  undefined ***pppuVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_02;
  const_string file_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  allocator_type local_169;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  allocator_type local_132;
  allocator<char> local_131;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x11b;
  file.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e0 = "";
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_58,(util *)&local_78,", ");
  pvVar2 = (iterator)0x2;
  pppuVar3 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_b8,&local_e8,0x11b,1,2,pppuVar3,"Join(std::vector<std::string>{}, \", \")","",
             "\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pppuVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x11c;
  file_00.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_110 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo",&local_131);
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_130,__l,&local_132);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_58,(util *)&local_130,", ");
  pvVar2 = (iterator)0x2;
  pppuVar3 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_b8,&local_118,0x11c,1,2,pppuVar3,
             "Join(std::vector<std::string>{\"foo\"}, \", \")","foo","\"foo\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  std::__cxx11::string::~string((string *)&local_78);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pppuVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x11d;
  file_01.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_50 = 0;
  local_58 = &PTR__lazy_ostream_01139f30;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"foo",&local_131);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"bar",(allocator<char> *)&local_132);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_130,__l_00,&local_169);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_78,(util *)&local_130,", ");
  pvVar2 = (iterator)0x2;
  pbVar4 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_58,&local_168,0x11d,1,2,pbVar4,
             "Join(std::vector<std::string>{\"foo\", \"bar\"}, \", \")","foo, bar","\"foo, bar\"");
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_b8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pbVar4;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x121;
  file_02.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_190,
             msg_02);
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  local_78.field_2._M_allocated_capacity = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78;
  local_78._M_string_length = (size_type)&local_78;
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            (&local_58,(util *)&local_78);
  pvVar2 = (iterator)0x2;
  pppuVar3 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_b8,&local_1a0,0x121,1,2,pppuVar3,
             "Join(std::list<std::string>{}, \", \", op_upper)","","\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pppuVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x122;
  file_03.m_begin = (iterator)&local_1b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c0,
             msg_03);
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo",&local_131);
  __l_01._M_len = 1;
  __l_01._M_array = &local_78;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_130,__l_01,&local_132);
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            (&local_58,(util *)&local_130);
  pvVar2 = (iterator)0x2;
  pppuVar3 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_b8,&local_1d0,0x122,1,2,pppuVar3,
             "Join(std::list<std::string>{\"foo\"}, \", \", op_upper)","FOO","\"FOO\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_130);
  std::__cxx11::string::~string((string *)&local_78);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pppuVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x123;
  file_04.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f0,
             msg_04);
  local_50 = 0;
  local_58 = &PTR__lazy_ostream_01139f30;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"foo",&local_131);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"bar",(allocator<char> *)&local_132);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_b8;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_130,__l_02,&local_169);
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            (&local_78,(util *)&local_130);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_58,&local_200,0x123,1,2,&local_78,
             "Join(std::list<std::string>{\"foo\", \"bar\"}, \", \", op_upper)","FOO, BAR",
             "\"FOO, BAR\"");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_130);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_b8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_Join)
{
    // Normal version
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{}, ", "), "");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo"}, ", "), "foo");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo", "bar"}, ", "), "foo, bar");

    // Version with unary operator
    const auto op_upper = [](const std::string& s) { return ToUpper(s); };
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{}, ", ", op_upper), "");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo"}, ", ", op_upper), "FOO");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo", "bar"}, ", ", op_upper), "FOO, BAR");
}